

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

uint64_t kmer_reverse(uint64_t kmer,uint8_t k)

{
  ulong uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000031,k);
  uVar1 = 0;
  uVar2 = (uint)uVar3;
  while (uVar2 != 0) {
    uVar2 = (uint)kmer;
    kmer = kmer >> 2;
    uVar1 = (ulong)(uVar2 & 3) + uVar1 * 4 ^ 3;
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
  }
  return uVar1;
}

Assistant:

uint64_t kmer_reverse(uint64_t kmer, uint8_t k) {
    uint64_t old_kmer=kmer;
    uint64_t rkmer=0;
    for (int pos=0;pos<k;++pos) {
        //std::cout<<"kmer: "
        //3->0 T->A     2->1 G C     1->2
        uint64_t nuc=3-(old_kmer%4);
        old_kmer>>=2;
        //std::cout<<"rc adding "<<nuc<<std::endl;
        rkmer<<=2;
        rkmer+=nuc;
    }
    return rkmer;
}